

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DropTable(Parse *pParse,SrcList *pName,int isView,int noErr)

{
  sqlite3 *db_00;
  char *zArg3;
  int iVar1;
  int iVar2;
  Table *pTable;
  char *zArg1;
  VTable *pVVar3;
  Vdbe *pVVar4;
  char *local_58;
  char *zArg2;
  char *zDb;
  char *zTab;
  int code;
  int iDb;
  sqlite3 *db;
  Vdbe *v;
  Table *pTab;
  int noErr_local;
  int isView_local;
  SrcList *pName_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if ((db_00->mallocFailed == '\0') && (iVar1 = sqlite3ReadSchema(pParse), iVar1 == 0)) {
    if (noErr != 0) {
      db_00->suppressErr = db_00->suppressErr + '\x01';
    }
    pTable = sqlite3LocateTableItem(pParse,isView,pName->a);
    if (noErr != 0) {
      db_00->suppressErr = db_00->suppressErr + 0xff;
    }
    if (pTable == (Table *)0x0) {
      if (noErr != 0) {
        sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].zDatabase);
        sqlite3ForceNotReadOnly(pParse);
      }
    }
    else {
      iVar1 = sqlite3SchemaToIndex(db_00,pTable->pSchema);
      if ((pTable->eTabType != '\x01') ||
         (iVar2 = sqlite3ViewGetColumnNames(pParse,pTable), iVar2 == 0)) {
        zArg1 = "sqlite_master";
        if (iVar1 == 1) {
          zArg1 = "sqlite_temp_master";
        }
        zArg3 = db_00->aDb[iVar1].zDbSName;
        local_58 = (char *)0x0;
        iVar2 = sqlite3AuthCheck(pParse,9,zArg1,(char *)0x0,zArg3);
        if (iVar2 == 0) {
          if (isView == 0) {
            if (pTable->eTabType == '\x01') {
              zTab._0_4_ = 0x1e;
              pVVar3 = sqlite3GetVTable(db_00,pTable);
              local_58 = pVVar3->pMod->zName;
            }
            else if (iVar1 == 1) {
              zTab._0_4_ = 0xd;
            }
            else {
              zTab._0_4_ = 0xb;
            }
          }
          else if (iVar1 == 1) {
            zTab._0_4_ = 0xf;
          }
          else {
            zTab._0_4_ = 0x11;
          }
          iVar2 = sqlite3AuthCheck(pParse,(int)zTab,pTable->zName,local_58,zArg3);
          if ((iVar2 == 0) &&
             (iVar2 = sqlite3AuthCheck(pParse,9,pTable->zName,(char *)0x0,zArg3), iVar2 == 0)) {
            iVar2 = tableMayNotBeDropped(db_00,pTable);
            if (iVar2 == 0) {
              if ((isView == 0) || (pTable->eTabType == '\x02')) {
                if ((isView == 0) && (pTable->eTabType == '\x02')) {
                  sqlite3ErrorMsg(pParse,"use DROP VIEW to delete view %s",pTable->zName);
                }
                else {
                  pVVar4 = sqlite3GetVdbe(pParse);
                  if (pVVar4 != (Vdbe *)0x0) {
                    sqlite3BeginWriteOperation(pParse,1,iVar1);
                    if (isView == 0) {
                      sqlite3ClearStatTables(pParse,iVar1,"tbl",pTable->zName);
                      sqlite3FkDropTable(pParse,pName,pTable);
                    }
                    sqlite3CodeDropTable(pParse,pTable,iVar1,isView);
                  }
                }
              }
              else {
                sqlite3ErrorMsg(pParse,"use DROP TABLE to delete table %s",pTable->zName);
              }
            }
            else {
              sqlite3ErrorMsg(pParse,"table %s may not be dropped",pTable->zName);
            }
          }
        }
      }
    }
  }
  sqlite3SrcListDelete(db_00,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTable(Parse *pParse, SrcList *pName, int isView, int noErr){
  Table *pTab;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  if( db->mallocFailed ){
    goto exit_drop_table;
  }
  assert( pParse->nErr==0 );
  assert( pName->nSrc==1 );
  if( sqlite3ReadSchema(pParse) ) goto exit_drop_table;
  if( noErr ) db->suppressErr++;
  assert( isView==0 || isView==LOCATE_VIEW );
  pTab = sqlite3LocateTableItem(pParse, isView, &pName->a[0]);
  if( noErr ) db->suppressErr--;

  if( pTab==0 ){
    if( noErr ){
      sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].zDatabase);
      sqlite3ForceNotReadOnly(pParse);
    }
    goto exit_drop_table;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 && iDb<db->nDb );

  /* If pTab is a virtual table, call ViewGetColumnNames() to ensure
  ** it is initialized.
  */
  if( IsVirtual(pTab) && sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_drop_table;
  }
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code;
    const char *zTab = SCHEMA_TABLE(iDb);
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zArg2 = 0;
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb)){
      goto exit_drop_table;
    }
    if( isView ){
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_VIEW;
      }else{
        code = SQLITE_DROP_VIEW;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( IsVirtual(pTab) ){
      code = SQLITE_DROP_VTABLE;
      zArg2 = sqlite3GetVTable(db, pTab)->pMod->zName;
#endif
    }else{
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_TABLE;
      }else{
        code = SQLITE_DROP_TABLE;
      }
    }
    if( sqlite3AuthCheck(pParse, code, pTab->zName, zArg2, zDb) ){
      goto exit_drop_table;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb) ){
      goto exit_drop_table;
    }
  }
#endif
  if( tableMayNotBeDropped(db, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be dropped", pTab->zName);
    goto exit_drop_table;
  }

#ifndef SQLITE_OMIT_VIEW
  /* Ensure DROP TABLE is not used on a view, and DROP VIEW is not used
  ** on a table.
  */
  if( isView && !IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "use DROP TABLE to delete table %s", pTab->zName);
    goto exit_drop_table;
  }
  if( !isView && IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "use DROP VIEW to delete view %s", pTab->zName);
    goto exit_drop_table;
  }
#endif

  /* Generate code to remove the table from the schema table
  ** on disk.
  */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    if( !isView ){
      sqlite3ClearStatTables(pParse, iDb, "tbl", pTab->zName);
      sqlite3FkDropTable(pParse, pName, pTab);
    }
    sqlite3CodeDropTable(pParse, pTab, iDb, isView);
  }

exit_drop_table:
  sqlite3SrcListDelete(db, pName);
}